

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

size_t __thiscall toml::basic_value<toml::type_config>::size(basic_value<toml::type_config> *this)

{
  array_type *this_00;
  string_type *this_01;
  basic_value<toml::type_config> *this_02;
  basic_value<toml::type_config> *in_RDI;
  nothrow_t *in_stack_fffffffffffffe48;
  basic_value<toml::type_config> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined6 in_stack_fffffffffffffe60;
  value_t vVar1;
  undefined1 uVar2;
  string *in_stack_fffffffffffffe68;
  type_error *in_stack_fffffffffffffe70;
  allocator<char> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_51;
  string *in_stack_ffffffffffffffd8;
  source_location *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  value_t in_stack_ffffffffffffffef;
  size_type local_8;
  
  vVar1 = in_RDI->type_;
  if (vVar1 == string) {
    this_01 = as_string_abi_cxx11_(in_RDI,(nothrow_t *)&std::nothrow);
    local_8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  }
  else if (vVar1 == array) {
    this_00 = as_array(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_8 = std::
              vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              ::size(this_00);
  }
  else {
    if (vVar1 != table) {
      uVar2 = 1;
      this_02 = (basic_value<toml::type_config> *)__cxa_allocate_exception(0xa0);
      __rhs = &local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      location(this_02);
      to_string_abi_cxx11_(in_stack_ffffffffffffffef);
      std::operator+((char *)in_RDI,__rhs);
      format_error<>((string *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      location(this_02);
      type_error::type_error
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (source_location *)CONCAT17(uVar2,CONCAT16(vVar1,in_stack_fffffffffffffe60)));
      __cxa_throw(this_02,&type_error::typeinfo,type_error::~type_error);
    }
    as_table_abi_cxx11_(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_8 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      *)0x69aecb);
  }
  return local_8;
}

Assistant:

std::size_t size() const
    {
        switch(this->type_)
        {
            case value_t::array:
            {
                return this->as_array(std::nothrow).size();
            }
            case value_t::table:
            {
                return this->as_table(std::nothrow).size();
            }
            case value_t::string:
            {
                return this->as_string(std::nothrow).size();
            }
            default:
            {
                throw type_error(format_error(
                    "toml::value::size(): bad_cast to container types",
                    this->location(),
                    "the actual type is " + to_string(this->type_)
                    ), this->location());
            }
        }
    }